

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.h
# Opt level: O1

BOOL Js::CrossSite::IsCrossSiteObjectTyped<Js::JavascriptNativeFloatArray>
               (JavascriptNativeFloatArray *obj)

{
  FinalizableObject FVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint uVar6;
  bool bVar7;
  
  FVar1.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (obj->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
       super_IRecyclerVisitedObject;
  bVar7 = FVar1.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject ==
          (IRecyclerVisitedObject)
          VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address;
  if ((!bVar7) &&
     (FVar1.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
      (IRecyclerVisitedObject)VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CrossSite.h"
                                ,0x1c,"(ret || VirtualTableInfo<T>::HasVirtualTable(obj))",
                                "ret || VirtualTableInfo<T>::HasVirtualTable(obj)");
    if (!bVar3) goto LAB_00aec92f;
    *puVar5 = 0;
  }
  uVar4 = (**(code **)((long)(obj->super_JavascriptNativeArray).super_JavascriptArray.
                             super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x330))(obj);
  uVar6 = (uint)bVar7;
  if (uVar4 != uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CrossSite.h"
                                ,0x1d,"(ret == obj->IsCrossSiteObject())",
                                "ret == obj->IsCrossSiteObject()");
    if (!bVar7) {
LAB_00aec92f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return uVar6;
}

Assistant:

static BOOL IsCrossSiteObjectTyped(T * obj)
        {
            BOOL ret = VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(obj);
            Assert(ret || VirtualTableInfo<T>::HasVirtualTable(obj));
            Assert(ret == obj->IsCrossSiteObject());
            return ret;
        }